

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_id_tc26_gost_3410_2012_256_paramSetA.c
# Opt level: O1

void point_add_proj(pt_prj_t_conflict4 *R,pt_prj_t_conflict4 *Q,pt_prj_t_conflict4 *P)

{
  uint64_t *out1;
  uint64_t *out1_00;
  uint64_t *out1_01;
  fe_t_conflict1 t0;
  fe_t_conflict1 t2;
  uint64_t local_178;
  long lStack_170;
  long local_168;
  long lStack_160;
  long local_158;
  long lStack_150;
  long local_148;
  long lStack_140;
  long local_138;
  long lStack_130;
  uint64_t local_128;
  long lStack_120;
  long local_118;
  long lStack_110;
  long local_108;
  long lStack_100;
  long local_f8;
  long lStack_f0;
  long local_e8;
  long lStack_e0;
  uint64_t local_d8;
  long lStack_d0;
  long local_c8;
  long lStack_c0;
  long local_b8;
  long lStack_b0;
  long local_a8;
  long lStack_a0;
  long local_98;
  long lStack_90;
  uint64_t local_88;
  long lStack_80;
  long local_78;
  long lStack_70;
  long local_68;
  long lStack_60;
  long local_58;
  long lStack_50;
  long local_48;
  long lStack_40;
  
  out1 = R->Y;
  out1_01 = R->T;
  out1_00 = R->Z;
  fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_mul(&local_178,Q->X,P->X);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_mul(&local_d8,Q->Y,P->Y);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_mul(&local_128,const_d,P->T);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_mul(&local_128,Q->T,&local_128);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_mul(&local_88,Q->Z,P->Z);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_add(R->X,Q->X,Q->Y);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_carry(R->X,R->X);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_add(out1,P->X,P->Y);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_carry(out1,out1);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_mul(out1_01,R->X,out1);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_sub(out1_00,out1_01,&local_178);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_carry(out1_00,out1_00);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_sub(out1_01,out1_00,&local_d8);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_carry(out1_01,out1_01);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_sub(out1_00,&local_88,&local_128);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_carry(out1_00,out1_00);
  local_88 = local_128 + local_88;
  lStack_80 = lStack_120 + lStack_80;
  local_78 = local_118 + local_78;
  lStack_70 = lStack_110 + lStack_70;
  local_68 = local_108 + local_68;
  lStack_60 = lStack_100 + lStack_60;
  local_58 = local_f8 + local_58;
  lStack_50 = lStack_f0 + lStack_50;
  local_48 = local_e8 + local_48;
  lStack_40 = lStack_e0 + lStack_40;
  fiat_id_tc26_gost_3410_2012_512_paramSetC_carry(&local_88,&local_88);
  local_d8 = (local_d8 - local_178) + 0x1ffffffffffb8e;
  lStack_d0 = (lStack_d0 - lStack_170) + 0xffffffffffffe;
  local_c8 = (local_c8 - local_168) + 0xffffffffffffe;
  lStack_c0 = (lStack_c0 - lStack_160) + 0xffffffffffffe;
  local_b8 = (local_b8 - local_158) + 0xffffffffffffe;
  lStack_b0 = (lStack_b0 - lStack_150) + 0x1ffffffffffffe;
  local_a8 = (local_a8 - local_148) + 0xffffffffffffe;
  lStack_a0 = (lStack_a0 - lStack_140) + 0xffffffffffffe;
  local_98 = (local_98 - local_138) + 0xffffffffffffe;
  lStack_90 = (lStack_90 - lStack_130) + 0xffffffffffffe;
  fiat_id_tc26_gost_3410_2012_512_paramSetC_carry(&local_d8,&local_d8);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_mul(R->X,out1_01,out1_00);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_mul(out1,&local_88,&local_d8);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_mul(out1_01,out1_01,&local_d8);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_mul(out1_00,out1_00,&local_88);
  return;
}

Assistant:

static void point_add_proj(pt_prj_t *R, const pt_prj_t *Q, const pt_prj_t *P) {
    /* temporary variables */
    fe_t t0, t1, t2, t3;
    /* constants */
    const limb_t *d = const_d;
    /* set pointers for Edwards curve arith */
    const limb_t *X1 = Q->X;
    const limb_t *Y1 = Q->Y;
    const limb_t *T1 = Q->T;
    const limb_t *Z1 = Q->Z;
    const limb_t *X2 = P->X;
    const limb_t *Y2 = P->Y;
    const limb_t *T2 = P->T;
    const limb_t *Z2 = P->Z;
    limb_t *X3 = R->X;
    limb_t *Y3 = R->Y;
    limb_t *T3 = R->T;
    limb_t *Z3 = R->Z;

    /* the curve arith formula */
    fiat_id_tc26_gost_3410_2012_256_paramSetA_carry_mul(t0, X1, X2);
    fiat_id_tc26_gost_3410_2012_256_paramSetA_carry_mul(t1, Y1, Y2);
    fiat_id_tc26_gost_3410_2012_256_paramSetA_carry_mul(t2, d, T2);
    fiat_id_tc26_gost_3410_2012_256_paramSetA_carry_mul(t2, T1, t2);
    fiat_id_tc26_gost_3410_2012_256_paramSetA_carry_mul(t3, Z1, Z2);
    fiat_id_tc26_gost_3410_2012_256_paramSetA_carry_add(X3, X1, Y1);
    fiat_id_tc26_gost_3410_2012_256_paramSetA_carry_add(Y3, X2, Y2);
    fiat_id_tc26_gost_3410_2012_256_paramSetA_carry_mul(T3, X3, Y3);
    fiat_id_tc26_gost_3410_2012_256_paramSetA_carry_sub(Z3, T3, t0);
    fiat_id_tc26_gost_3410_2012_256_paramSetA_carry_sub(T3, Z3, t1);
    fiat_id_tc26_gost_3410_2012_256_paramSetA_carry_sub(Z3, t3, t2);
    fiat_id_tc26_gost_3410_2012_256_paramSetA_carry_add(t3, t3, t2);
    fiat_id_tc26_gost_3410_2012_256_paramSetA_carry_sub(t1, t1, t0);
    fiat_id_tc26_gost_3410_2012_256_paramSetA_carry_mul(X3, T3, Z3);
    fiat_id_tc26_gost_3410_2012_256_paramSetA_carry_mul(Y3, t3, t1);
    fiat_id_tc26_gost_3410_2012_256_paramSetA_carry_mul(T3, T3, t1);
    fiat_id_tc26_gost_3410_2012_256_paramSetA_carry_mul(Z3, Z3, t3);
}